

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.cc
# Opt level: O2

void CRYPTO_hchacha20(uint8_t *out,uint8_t *key,uint8_t *nonce)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  uVar1 = *(uint *)key;
  uVar2 = *(uint *)(key + 4);
  uVar4 = *(uint *)(key + 8);
  uVar11 = *(uint *)(key + 0xc);
  local_54 = *(uint *)(key + 0x10);
  local_44 = *(uint *)(key + 0x14);
  local_48 = *(uint *)(key + 0x18);
  local_4c = *(uint *)(key + 0x1c);
  uVar8 = *(uint *)nonce;
  uVar7 = *(uint *)(nonce + 4);
  uVar5 = *(uint *)(nonce + 8);
  uVar3 = *(uint *)(nonce + 0xc);
  local_50 = 0x61707865;
  uVar14 = 0x3320646e;
  uVar13 = 0x79622d32;
  uVar12 = 0x6b206574;
  for (uVar6 = 0; uVar6 < 0x14; uVar6 = uVar6 + 2) {
    uVar8 = uVar8 ^ local_50 + uVar1;
    uVar9 = uVar8 << 0x10 | uVar8 >> 0x10;
    local_54 = local_54 + uVar9;
    uVar8 = uVar1 ^ local_54;
    uVar8 = uVar8 << 0xc | uVar8 >> 0x14;
    local_50 = local_50 + uVar1 + uVar8;
    uVar9 = uVar9 ^ local_50;
    uVar10 = uVar9 << 8 | uVar9 >> 0x18;
    local_54 = local_54 + uVar10;
    uVar8 = uVar8 ^ local_54;
    uVar1 = uVar8 << 7 | uVar8 >> 0x19;
    uVar7 = uVar7 ^ uVar14 + uVar2;
    uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
    local_44 = local_44 + uVar7;
    uVar8 = uVar2 ^ local_44;
    uVar8 = uVar8 << 0xc | uVar8 >> 0x14;
    uVar14 = uVar14 + uVar2 + uVar8;
    uVar7 = uVar7 ^ uVar14;
    uVar9 = uVar7 << 8 | uVar7 >> 0x18;
    local_44 = local_44 + uVar9;
    uVar8 = uVar8 ^ local_44;
    uVar2 = uVar8 << 7 | uVar8 >> 0x19;
    uVar5 = uVar5 ^ uVar13 + uVar4;
    uVar8 = uVar5 << 0x10 | uVar5 >> 0x10;
    local_48 = local_48 + uVar8;
    uVar7 = uVar4 ^ local_48;
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    uVar13 = uVar13 + uVar4 + uVar7;
    uVar8 = uVar8 ^ uVar13;
    uVar5 = uVar8 << 8 | uVar8 >> 0x18;
    local_48 = local_48 + uVar5;
    uVar7 = uVar7 ^ local_48;
    uVar8 = uVar7 << 7 | uVar7 >> 0x19;
    uVar3 = uVar3 ^ uVar12 + uVar11;
    uVar4 = uVar3 << 0x10 | uVar3 >> 0x10;
    local_4c = local_4c + uVar4;
    uVar7 = uVar11 ^ local_4c;
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    uVar12 = uVar12 + uVar11 + uVar7;
    uVar4 = uVar4 ^ uVar12;
    uVar4 = uVar4 << 8 | uVar4 >> 0x18;
    local_4c = local_4c + uVar4;
    uVar7 = uVar7 ^ local_4c;
    uVar7 = uVar7 << 7 | uVar7 >> 0x19;
    local_50 = local_50 + uVar2;
    uVar4 = uVar4 ^ local_50;
    uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
    local_48 = local_48 + uVar4;
    uVar2 = uVar2 ^ local_48;
    uVar2 = uVar2 << 0xc | uVar2 >> 0x14;
    local_50 = local_50 + uVar2;
    uVar4 = uVar4 ^ local_50;
    uVar3 = uVar4 << 8 | uVar4 >> 0x18;
    local_48 = local_48 + uVar3;
    uVar2 = uVar2 ^ local_48;
    uVar2 = uVar2 << 7 | uVar2 >> 0x19;
    uVar14 = uVar14 + uVar8;
    uVar10 = uVar10 ^ uVar14;
    uVar11 = uVar10 << 0x10 | uVar10 >> 0x10;
    local_4c = local_4c + uVar11;
    uVar8 = uVar8 ^ local_4c;
    uVar4 = uVar8 << 0xc | uVar8 >> 0x14;
    uVar14 = uVar14 + uVar4;
    uVar11 = uVar11 ^ uVar14;
    uVar8 = uVar11 << 8 | uVar11 >> 0x18;
    local_4c = local_4c + uVar8;
    uVar4 = uVar4 ^ local_4c;
    uVar4 = uVar4 << 7 | uVar4 >> 0x19;
    uVar13 = uVar13 + uVar7;
    uVar9 = uVar9 ^ uVar13;
    uVar11 = uVar9 << 0x10 | uVar9 >> 0x10;
    local_54 = local_54 + uVar11;
    uVar7 = uVar7 ^ local_54;
    uVar9 = uVar7 << 0xc | uVar7 >> 0x14;
    uVar13 = uVar13 + uVar9;
    uVar11 = uVar11 ^ uVar13;
    uVar7 = uVar11 << 8 | uVar11 >> 0x18;
    local_54 = local_54 + uVar7;
    uVar9 = uVar9 ^ local_54;
    uVar11 = uVar9 << 7 | uVar9 >> 0x19;
    uVar12 = uVar12 + uVar1;
    uVar5 = uVar5 ^ uVar12;
    uVar5 = uVar5 << 0x10 | uVar5 >> 0x10;
    local_44 = local_44 + uVar5;
    uVar1 = uVar1 ^ local_44;
    uVar1 = uVar1 << 0xc | uVar1 >> 0x14;
    uVar12 = uVar12 + uVar1;
    uVar5 = uVar5 ^ uVar12;
    uVar5 = uVar5 << 8 | uVar5 >> 0x18;
    local_44 = local_44 + uVar5;
    uVar1 = uVar1 ^ local_44;
    uVar1 = uVar1 << 7 | uVar1 >> 0x19;
  }
  *(uint *)out = local_50;
  *(uint *)(out + 4) = uVar14;
  *(uint *)(out + 8) = uVar13;
  *(uint *)(out + 0xc) = uVar12;
  *(uint *)(out + 0x10) = uVar8;
  *(uint *)(out + 0x14) = uVar7;
  *(uint *)(out + 0x18) = uVar5;
  *(uint *)(out + 0x1c) = uVar3;
  return;
}

Assistant:

void CRYPTO_hchacha20(uint8_t out[32], const uint8_t key[32],
                      const uint8_t nonce[16]) {
  uint32_t x[16];
  OPENSSL_memcpy(x, sigma, sizeof(sigma));
  OPENSSL_memcpy(&x[4], key, 32);
  OPENSSL_memcpy(&x[12], nonce, 16);

  for (size_t i = 0; i < 20; i += 2) {
    QUARTERROUND(0, 4, 8, 12)
    QUARTERROUND(1, 5, 9, 13)
    QUARTERROUND(2, 6, 10, 14)
    QUARTERROUND(3, 7, 11, 15)
    QUARTERROUND(0, 5, 10, 15)
    QUARTERROUND(1, 6, 11, 12)
    QUARTERROUND(2, 7, 8, 13)
    QUARTERROUND(3, 4, 9, 14)
  }

  OPENSSL_memcpy(out, &x[0], sizeof(uint32_t) * 4);
  OPENSSL_memcpy(&out[16], &x[12], sizeof(uint32_t) * 4);
}